

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::uintwide_t<32U,_unsigned_int,_void,_true>::eval_divide_knuth
          (uintwide_t<32U,_unsigned_int,_void,_true> *this,
          uintwide_t<32U,_unsigned_int,_void,_true> *other,
          uintwide_t<32U,_unsigned_int,_void,_true> *remainder)

{
  bool bVar1;
  reference pvVar2;
  iterator first;
  iterator last;
  bool bVar3;
  array<unsigned_int,_1UL> local_68;
  array<unsigned_int,_1UL> local_64;
  array<unsigned_int,_1UL> local_60;
  undefined1 local_5b;
  undefined1 local_5a;
  int_fast8_t local_59;
  array<unsigned_int,_1UL> local_58;
  bool left_is_equal_to_right;
  bool left_is_less_than_right;
  array<unsigned_int,_1UL> aStack_54;
  int_fast8_t result_of_compare_left_with_right;
  reverse_iterator<const_unsigned_int_*> local_50;
  reverse_iterator<const_unsigned_int_*> local_48;
  reverse_iterator<const_unsigned_int_*> local_40;
  const_reverse_iterator crit_v;
  const_reverse_iterator crit_u;
  local_uint_index_type v_offset;
  local_uint_index_type u_offset;
  uintwide_t<32U,_unsigned_int,_void,_true> *remainder_local;
  uintwide_t<32U,_unsigned_int,_void,_true> *other_local;
  uintwide_t<32U,_unsigned_int,_void,_true> *this_local;
  
  v_offset = 0;
  crit_u.current = (uint *)0x0;
  crit_v = detail::array_detail::array<unsigned_int,_1UL>::crbegin((array<unsigned_int,_1UL> *)this)
  ;
  local_40.current =
       (uint *)detail::array_detail::array<unsigned_int,_1UL>::crbegin
                         ((array<unsigned_int,_1UL> *)other);
  while( true ) {
    local_48.current =
         (uint *)detail::array_detail::array<unsigned_int,_1UL>::crend
                           ((array<unsigned_int,_1UL> *)this);
    bVar1 = detail::iterator_detail::operator!=(&crit_v,&local_48);
    bVar3 = false;
    if (bVar1) {
      pvVar2 = detail::iterator_detail::reverse_iterator<const_unsigned_int_*>::operator*(&crit_v);
      bVar3 = *pvVar2 == 0;
    }
    if (!bVar3) break;
    detail::iterator_detail::reverse_iterator<const_unsigned_int_*>::operator++(&crit_v);
    v_offset = v_offset + 1;
  }
  while( true ) {
    local_50.current =
         (uint *)detail::array_detail::array<unsigned_int,_1UL>::crend
                           ((array<unsigned_int,_1UL> *)other);
    bVar1 = detail::iterator_detail::operator!=(&local_40,&local_50);
    bVar3 = false;
    if (bVar1) {
      pvVar2 = detail::iterator_detail::reverse_iterator<const_unsigned_int_*>::operator*(&local_40)
      ;
      bVar3 = *pvVar2 == 0;
    }
    if (!bVar3) break;
    detail::iterator_detail::reverse_iterator<const_unsigned_int_*>::operator++(&local_40);
    crit_u.current = crit_u.current + 1;
  }
  if (crit_u.current == (uint *)0x1) {
    aStack_54.elems[0] = (value_type_conflict  [1])limits_helper_max<true>();
    (this->values).super_array<unsigned_int,_1UL>.elems[0] = (value_type_conflict)aStack_54.elems[0]
    ;
    if (remainder != (uintwide_t<32U,_unsigned_int,_void,_true> *)0x0) {
      first = detail::array_detail::array<unsigned_int,_1UL>::begin
                        ((array<unsigned_int,_1UL> *)remainder);
      last = detail::array_detail::array<unsigned_int,_1UL>::end
                       ((array<unsigned_int,_1UL> *)remainder);
      detail::fill_unsafe<unsigned_int*,unsigned_int>(first,last,0);
    }
  }
  else if (v_offset == 1) {
    if (remainder != (uintwide_t<32U,_unsigned_int,_void,_true> *)0x0) {
      uintwide_t<32u,unsigned_int,void,true>::uintwide_t<unsigned_char>(unsigned_char,std::
      enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
      value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::
      digits),void>::type__
                (&local_58,'\0',
                 (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                  *)0x0);
      (remainder->values).super_array<unsigned_int,_1UL>.elems[0] =
           (value_type_conflict)local_58.elems[0];
    }
  }
  else {
    local_59 = compare<true,_nullptr>(this,other);
    local_5a = local_59 == -1;
    local_5b = local_59 == '\0';
    if ((bool)local_5a) {
      if (remainder != (uintwide_t<32U,_unsigned_int,_void,_true> *)0x0) {
        (remainder->values).super_array<unsigned_int,_1UL>.elems[0] =
             (this->values).super_array<unsigned_int,_1UL>.elems[0];
      }
      uintwide_t<32u,unsigned_int,void,true>::uintwide_t<unsigned_char>(unsigned_char,std::
      enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
      value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::
      digits),void>::type__
                (&local_60,'\0',
                 (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                  *)0x0);
      (this->values).super_array<unsigned_int,_1UL>.elems[0] =
           (value_type_conflict)local_60.elems[0];
    }
    else if ((bool)local_5b) {
      uintwide_t<32u,unsigned_int,void,true>::uintwide_t<unsigned_char>(unsigned_char,std::
      enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
      value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::
      digits),void>::type__
                (&local_64,'\x01',
                 (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                  *)0x0);
      (this->values).super_array<unsigned_int,_1UL>.elems[0] =
           (value_type_conflict)local_64.elems[0];
      if (remainder != (uintwide_t<32U,_unsigned_int,_void,_true> *)0x0) {
        uintwide_t<32u,unsigned_int,void,true>::uintwide_t<unsigned_char>(unsigned_char,std::
        enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
        value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::
        digits),void>::type__
                  (&local_68,'\0',
                   (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                    *)0x0);
        (remainder->values).super_array<unsigned_int,_1UL>.elems[0] =
             (value_type_conflict)local_68.elems[0];
      }
    }
    else {
      void_math::wide_integer::uintwide_t<32u,unsigned_int,void,true>::
      eval_divide_knuth_core<32u>(unsigned_long,unsigned_long,math::wide_integer::
      uintwide_t<32u,unsigned_int,void,true>const&,math::wide_integer::
      uintwide_t<32u,unsigned_int,void,true>*,std::enable_if<(32u)<=(static_cast<unsigned_int>(std::
      numeric_limits<unsigned_int>::digits)),int>::type__
                (this,v_offset,(unsigned_fast_type)crit_u.current,other,remainder,
                 (enable_if_t<(32U_<__static_cast<size_t>(std::numeric_limits<limb_type>::digits)),_int>
                  *)0x0);
    }
  }
  return;
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }